

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT> *
wasm::WATParser::heaptype<wasm::WATParser::ParseTypeDefsCtx>
          (Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
           *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  __index_type *p_Var1;
  undefined8 uVar2;
  undefined4 uVar3;
  bool bVar4;
  HeapTypeT *pHVar5;
  bool bVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  HeapTypeT HVar8;
  allocator<char> local_279;
  string local_278;
  Err local_258;
  Err local_238;
  Err *local_218;
  Err *err_2;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT> _val_2;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT> t;
  Shareability share;
  HeapTypeT local_188;
  allocator<char> local_171;
  string local_170;
  Err local_150;
  Err local_130;
  Err *local_110;
  Err *err_1;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT> _val_1;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT> t_2;
  Err local_a0;
  Err *local_80;
  Err *err;
  undefined1 local_68 [8];
  MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT> _val;
  MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT> t_1;
  ParseTypeDefsCtx *ctx_local;
  
  maybeTypeidx<wasm::WATParser::ParseTypeDefsCtx>
            ((MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
              *)((long)&_val.val.
                        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                + 0x20),ctx);
  bVar4 = wasm::MaybeResult::operator_cast_to_bool
                    ((MaybeResult *)
                     ((long)&_val.val.
                             super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                     + 0x20));
  if (bVar4) {
    MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::
    MaybeResult((MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                 *)local_68,
                (MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                 *)((long)&_val.val.
                           super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                   + 0x20));
    local_80 = MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
               ::getErr((MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                         *)local_68);
    bVar4 = local_80 != (Err *)0x0;
    if (bVar4) {
      wasm::Err::Err(&local_a0,local_80);
      Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::Result
                (__return_storage_ptr__,&local_a0);
      wasm::Err::~Err(&local_a0);
    }
    MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::
    ~MaybeResult((MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                  *)local_68);
    if (!bVar4) {
      pHVar5 = MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
               ::operator*((MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                            *)((long)&_val.val.
                                      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                                      .
                                      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                                      .
                                      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                                      .
                                      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                              + 0x20));
      Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::
      Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT&>
                (__return_storage_ptr__,pHVar5);
      bVar4 = true;
    }
  }
  else {
    bVar4 = false;
  }
  MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::
  ~MaybeResult((MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                *)((long)&_val.val.
                          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                  + 0x20));
  if (!bVar4) {
    bVar7 = sv("exact",5);
    bVar4 = Lexer::takeSExprStart(&ctx->in,bVar7);
    if (bVar4) {
      p_Var1 = (__index_type *)
               ((long)&_val_1.val.
                       super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               + 0x20);
      typeidx<wasm::WATParser::ParseTypeDefsCtx>
                ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                  *)p_Var1,ctx);
      Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::Result
                ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                  *)&err_1,
                 (Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                  *)p_Var1);
      local_110 = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                  ::getErr((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                            *)&err_1);
      bVar4 = local_110 == (Err *)0x0;
      if (!bVar4) {
        wasm::Err::Err(&local_130,local_110);
        Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::Result
                  (__return_storage_ptr__,&local_130);
        wasm::Err::~Err(&local_130);
      }
      Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::~Result
                ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                  *)&err_1);
      if (bVar4) {
        bVar4 = Lexer::takeRParen(&ctx->in);
        if (bVar4) {
          pHVar5 = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                   ::operator*((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                                *)((long)&_val_1.val.
                                          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                  + 0x20));
          uVar2 = pHVar5->type;
          uVar3 = pHVar5->exactness;
          HVar8.exactness = uVar3;
          HVar8.type.id = uVar2;
          HVar8._12_4_ = 0;
          HVar8 = TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::makeExact
                            (&ctx->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>,HVar8);
          local_188.type = HVar8.type.id;
          local_188.exactness = HVar8.exactness;
          Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::
          Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                    (__return_storage_ptr__,&local_188);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_170,"expected end of exact heap type",&local_171);
          Lexer::err(&local_150,&ctx->in,&local_170);
          Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::
          Result(__return_storage_ptr__,&local_150);
          wasm::Err::~Err(&local_150);
          std::__cxx11::string::~string((string *)&local_170);
          std::allocator<char>::~allocator(&local_171);
        }
      }
      Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::~Result
                ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                  *)((long)&_val_1.val.
                            super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                    + 0x20));
    }
    else {
      bVar7 = sv("shared",6);
      bVar4 = Lexer::takeSExprStart(&ctx->in,bVar7);
      p_Var1 = (__index_type *)
               ((long)&_val_2.val.
                       super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               + 0x20);
      absheaptype<wasm::WATParser::ParseTypeDefsCtx>
                ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                  *)p_Var1,ctx,(uint)!bVar4);
      Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::Result
                ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                  *)&err_2,
                 (Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                  *)p_Var1);
      local_218 = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                  ::getErr((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                            *)&err_2);
      bVar6 = local_218 == (Err *)0x0;
      if (!bVar6) {
        wasm::Err::Err(&local_238,local_218);
        Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::Result
                  (__return_storage_ptr__,&local_238);
        wasm::Err::~Err(&local_238);
      }
      Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::~Result
                ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                  *)&err_2);
      if (bVar6) {
        if ((!bVar4 != Shared) || (bVar4 = Lexer::takeRParen(&ctx->in), bVar4)) {
          pHVar5 = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                   ::operator*((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                                *)((long)&_val_2.val.
                                          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                          .
                                          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                  + 0x20));
          Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::
          Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT&>
                    (__return_storage_ptr__,pHVar5);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_278,"expected end of shared abstract heap type",&local_279);
          Lexer::err(&local_258,&ctx->in,&local_278);
          Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::
          Result(__return_storage_ptr__,&local_258);
          wasm::Err::~Err(&local_258);
          std::__cxx11::string::~string((string *)&local_278);
          std::allocator<char>::~allocator(&local_279);
        }
      }
      Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::~Result
                ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                  *)((long)&_val_2.val.
                            super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                    + 0x20));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::HeapTypeT> heaptype(Ctx& ctx) {
  if (auto t = maybeTypeidx(ctx)) {
    CHECK_ERR(t);
    return *t;
  }

  if (ctx.in.takeSExprStart("exact"sv)) {
    auto t = typeidx(ctx);
    CHECK_ERR(t);
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of exact heap type");
    }
    return ctx.makeExact(*t);
  }

  auto share = ctx.in.takeSExprStart("shared"sv) ? Shared : Unshared;
  auto t = absheaptype(ctx, share);
  CHECK_ERR(t);
  if (share == Shared && !ctx.in.takeRParen()) {
    return ctx.in.err("expected end of shared abstract heap type");
  }
  return *t;
}